

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int UTF8ToHtml(uchar *out,int *outlen,uchar *in,int *inlen)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  htmlEntityDesc *phVar5;
  size_t sVar6;
  undefined1 *puVar7;
  int local_8c;
  int i;
  int len;
  int seqlen;
  uint d;
  uint c;
  char nbuf [16];
  char *cp;
  htmlEntityDesc *ent;
  int ret;
  uchar *outend;
  uchar *outstart;
  uchar *inend;
  uchar *instart;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  ent._4_4_ = -3;
  if (((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) {
    out_local._4_4_ = -1;
  }
  else if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    out_local._4_4_ = 0;
  }
  else {
    iVar1 = *inlen;
    iVar2 = *outlen;
    inlen_local = (int *)in;
    outlen_local = (int *)out;
    while( true ) {
      if (in + iVar1 <= inlen_local) break;
      uVar3 = (uint)(byte)*inlen_local;
      if (uVar3 < 0x80) {
        if (out + iVar2 <= outlen_local) goto LAB_00194ee4;
        *(byte *)outlen_local = (byte)*inlen_local;
        inlen_local = (int *)((long)inlen_local + 1);
        outlen_local = (int *)((long)outlen_local + 1);
      }
      else {
        if (uVar3 < 0xe0) {
          seqlen = uVar3 & 0x1f;
          i = 2;
        }
        else if (uVar3 < 0xf0) {
          seqlen = uVar3 & 0xf;
          i = 3;
        }
        else {
          seqlen = uVar3 & 7;
          i = 4;
        }
        if ((long)(in + iVar1) - (long)inlen_local < (long)i) break;
        for (local_8c = 1; local_8c < i; local_8c = local_8c + 1) {
          seqlen = *(byte *)((long)inlen_local + (long)local_8c) & 0x3f | seqlen << 6;
        }
        phVar5 = htmlEntityValueLookup(seqlen);
        if (phVar5 == (htmlEntityDesc *)0x0) {
          snprintf((char *)&d,0x10,"#%u",(ulong)(uint)seqlen);
          nbuf._8_8_ = &d;
        }
        else {
          nbuf._8_8_ = phVar5->name;
        }
        sVar6 = strlen((char *)nbuf._8_8_);
        iVar4 = (int)sVar6;
        if ((long)(out + iVar2) - (long)outlen_local < (long)(iVar4 + 2)) goto LAB_00194ee4;
        *(undefined1 *)outlen_local = 0x26;
        memcpy((void *)((long)outlen_local + 1),(void *)nbuf._8_8_,(long)iVar4);
        puVar7 = (undefined1 *)((long)outlen_local + 1 + (long)iVar4);
        outlen_local = (int *)(puVar7 + 1);
        *puVar7 = 0x3b;
        inlen_local = (int *)((long)inlen_local + (long)i);
      }
    }
    ent._4_4_ = (int)outlen_local - (int)out;
LAB_00194ee4:
    *outlen = (int)outlen_local - (int)out;
    *inlen = (int)inlen_local - (int)in;
    out_local._4_4_ = ent._4_4_;
  }
  return out_local._4_4_;
}

Assistant:

int
UTF8ToHtml(unsigned char* out, int *outlen,
           const unsigned char* in, int *inlen) {
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned char* outstart = out;
    unsigned char* outend;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);

    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(XML_ENC_ERR_SUCCESS);
    }

    inend = in + *inlen;
    outend = out + *outlen;
    while (in < inend) {
        const htmlEntityDesc *ent;
        const char *cp;
        char nbuf[16];
        unsigned c, d;
        int seqlen, len, i;

	d = *in;

	if (d < 0x80) {
            if (out >= outend)
                goto done;
            *out++ = d;
            in += 1;
            continue;
        }

        if (d < 0xE0)      { c = d & 0x1F; seqlen = 2; }
        else if (d < 0xF0) { c = d & 0x0F; seqlen = 3; }
        else               { c = d & 0x07; seqlen = 4; }

	if (inend - in < seqlen)
	    break;

	for (i = 1; i < seqlen; i++) {
	    d = in[i];
	    c <<= 6;
	    c |= d & 0x3F;
	}

        /*
         * Try to lookup a predefined HTML entity for it
         */
        ent = htmlEntityValueLookup(c);

        if (ent == NULL) {
          snprintf(nbuf, sizeof(nbuf), "#%u", c);
          cp = nbuf;
        } else {
          cp = ent->name;
        }

        len = strlen(cp);
        if (outend - out < len + 2)
            goto done;

        *out++ = '&';
        memcpy(out, cp, len);
        out += len;
        *out++ = ';';

        in += seqlen;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}